

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Gluco::Heap<Gluco::SimpSolver::ElimLt>::update(Heap<Gluco::SimpSolver::ElimLt> *this,int n)

{
  int i;
  
  if (n < (this->indices).sz) {
    i = (this->indices).data[n];
    if (-1 < i) {
      percolateUp(this,i);
      percolateDown(this,(this->indices).data[n]);
      return;
    }
  }
  insert(this,n);
  return;
}

Assistant:

void update(int n)
    {
        if (!inHeap(n))
            insert(n);
        else {
            percolateUp(indices[n]);
            percolateDown(indices[n]); }
    }